

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O2

void __thiscall MkvInterface::~MkvInterface(MkvInterface *this)

{
  EbmlStream *this_00;
  pointer ppuVar1;
  pointer ppuVar2;
  reference ppuVar3;
  int in_ESI;
  size_t i;
  ulong __n;
  
  if (this->m_file != (StdIOCallback *)0x0) {
    close(this,in_ESI);
  }
  this_00 = this->aStream;
  if (this_00 != (EbmlStream *)0x0) {
    libebml::EbmlStream::~EbmlStream(this_00);
    operator_delete(this_00,8);
  }
  this->aStream = (EbmlStream *)0x0;
  __n = 0;
  while( true ) {
    ppuVar1 = (this->m_attachmentBuffer).
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppuVar2 = (this->m_attachmentBuffer).
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppuVar2 - (long)ppuVar1 >> 3) <= __n) break;
    ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::at
                        (&this->m_attachmentBuffer,__n);
    if (*ppuVar3 != (value_type)0x0) {
      operator_delete__(*ppuVar3);
    }
    __n = __n + 1;
  }
  if (ppuVar2 != ppuVar1) {
    (this->m_attachmentBuffer).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppuVar1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_keyPositions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_timeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_attachmentSize).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_attachmentID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            (&(this->m_attachmentBuffer).
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            (&(this->m_frameBuffer).
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
  libebml::EbmlMaster::~EbmlMaster(&(this->m_fileSegment).super_EbmlMaster);
  return;
}

Assistant:

MkvInterface::~MkvInterface()
{
    if (m_file != NULL)
        close();
    
    if (aStream != NULL)
        delete aStream;
    aStream = NULL;
    
    for (size_t i=0; i<m_attachmentBuffer.size(); i++)
        delete[] m_attachmentBuffer.at(i);
    m_attachmentBuffer.clear();
}